

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConfigDeclarationSyntax * __thiscall
slang::parsing::Parser::parseConfigDeclaration(Parser *this,AttrList attributes)

{
  SyntaxFactory *this_00;
  SyntaxNode *pSVar1;
  Token semi1;
  Token design;
  Token semi2;
  Info *pIVar2;
  undefined8 uVar3;
  Info *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Info *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  TokenKind TVar11;
  SyntaxKind SVar12;
  int iVar13;
  ParameterDeclarationBaseSyntax *parameter;
  DeclaratorSyntax *pDVar14;
  ConfigCellIdentifierSyntax *pCVar15;
  SourceLocation location;
  Diagnostic *pDVar16;
  ConfigLiblistSyntax *pCVar17;
  undefined8 uVar18;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConfigDeclarationSyntax *pCVar19;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *ctx;
  SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL> *attributes_00;
  SyntaxNode *this_01;
  SyntaxNode **ppSVar20;
  Token TVar21;
  Token nameToken;
  SourceRange SVar22;
  Token TVar23;
  Token TVar24;
  string_view sVar25;
  Token config;
  Token topModule;
  SyntaxNode *local_2a8;
  SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL> instanceNames;
  Token token;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> local_218;
  Info *local_1e0;
  undefined8 local_1d8;
  Info *local_1d0;
  undefined8 local_1c8;
  Info *local_1c0;
  undefined8 local_1b8;
  Info *local_1b0;
  undefined8 local_1a8;
  pointer local_1a0;
  size_t local_198;
  Info *local_190;
  SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL> rules;
  SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL> topCells;
  SyntaxList<slang::syntax::ConfigRuleSyntax> local_a8;
  SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL> localparams;
  
  local_198 = (size_t)attributes._M_extent._M_extent_value;
  local_1a0 = attributes._M_ptr;
  TVar21 = ParserBase::consume(&this->super_ParserBase);
  local_1c0 = TVar21.info;
  local_1b8 = TVar21._0_8_;
  nameToken = ParserBase::expect(&this->super_ParserBase,Identifier);
  TVar21 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  localparams.super_SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>.data_ =
       (pointer)localparams.
                super_SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>.
                firstElement;
  localparams.super_SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>.len = 0;
  localparams.super_SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>.cap = 5;
  this_00 = &this->factory;
  while( true ) {
    local_1b0 = TVar21.info;
    local_1a8 = TVar21._0_8_;
    bVar10 = ParserBase::peek(&this->super_ParserBase,LocalParamKeyword);
    if (!bVar10) break;
    Token::Token((Token *)&rules);
    TVar21 = ParserBase::consume(&this->super_ParserBase);
    parameter = parseParameterDecl(this,TVar21,(Token *)&rules);
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len =
         CONCAT44(topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len.
                  _4_4_,1);
    topCells.stackBase[0] = '\0';
    topCells.stackBase[1] = '\0';
    topCells.stackBase[2] = '\0';
    topCells.stackBase[3] = '\0';
    topCells.stackBase[4] = '\0';
    topCells.stackBase[5] = '\0';
    topCells.stackBase[6] = '\0';
    topCells.stackBase[7] = '\0';
    topCells.stackBase[8] = '\0';
    topCells.stackBase[9] = '\0';
    topCells.stackBase[10] = '\0';
    topCells.stackBase[0xb] = '\0';
    topCells.stackBase[0xc] = '\0';
    topCells.stackBase[0xd] = '\0';
    topCells.stackBase[0xe] = '\0';
    topCells.stackBase[0xf] = '\0';
    topCells.stackBase[0x10] = '\0';
    topCells.stackBase[0x11] = '\0';
    topCells.stackBase[0x12] = '\0';
    topCells.stackBase[0x13] = '\0';
    topCells.stackBase[0x14] = '\0';
    topCells.stackBase[0x15] = '\0';
    topCells.stackBase[0x16] = '\0';
    topCells.stackBase[0x17] = '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.cap = 0;
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[0] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[1] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[2] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[3] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[4] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[5] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[6] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.firstElement[7] =
         '\0';
    topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.data_ =
         (pointer)&PTR_getChild_006a3268;
    instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.data_ =
         (pointer)slang::syntax::SyntaxFactory::parameterDeclarationStatement
                            (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&topCells
                             ,parameter,
                             (Token)rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.
                                    _0_16_);
    SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax*>::
    emplace_back<slang::syntax::ParameterDeclarationStatementSyntax*>
              ((SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax*> *)&localparams,
               (ParameterDeclarationStatementSyntax **)&instanceNames);
    TVar21.info = local_1b0;
    TVar21.kind = (undefined2)local_1a8;
    TVar21._2_1_ = local_1a8._2_1_;
    TVar21.numFlags.raw = local_1a8._3_1_;
    TVar21.rawLen = local_1a8._4_4_;
    if ((parameter->super_SyntaxNode).kind == ParameterDeclaration) {
      ppSVar20 = &parameter[1].super_SyntaxNode.parent;
      topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len = 0;
      pSVar1 = parameter[2].super_SyntaxNode.previewNode;
      topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.data_ =
           (pointer)ppSVar20;
      for (; (TVar21.info = local_1b0, TVar21.kind = (undefined2)local_1a8,
             TVar21._2_1_ = local_1a8._2_1_, TVar21.numFlags.raw = local_1a8._3_1_,
             TVar21.rawLen = local_1a8._4_4_,
             topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.data_ !=
             (pointer)ppSVar20 ||
             (topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len !=
              (ulong)((long)&pSVar1->kind + 1) >> 1));
          topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len =
               topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len + 1)
      {
        pDVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                  iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference
                            ((iterator_base<slang::syntax::DeclaratorSyntax_*> *)&topCells);
        if (pDVar14->initializer != (EqualsValueClauseSyntax *)0x0) {
          this_01 = &((pDVar14->initializer->expr).ptr)->super_SyntaxNode;
          SVar12 = ((SyntaxNode *)&this_01->kind)->kind;
          if (SVar12 == ParenthesizedExpression) {
            this_01 = this_01[1].previewNode;
            SVar12 = this_01->kind;
          }
          if ((((0x3a < SVar12 - StringLiteralExpression) ||
               ((0x400000000040001U >> ((ulong)(SVar12 - StringLiteralExpression) & 0x3f) & 1) == 0)
               ) && (SVar12 != IntegerLiteralExpression)) &&
             (((SVar12 != IntegerVectorExpression && (SVar12 != NullLiteralExpression)) &&
              (SVar12 != RealLiteralExpression)))) {
            SVar22 = slang::syntax::SyntaxNode::sourceRange(this_01);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb0005,SVar22);
          }
        }
      }
    }
  }
  TVar23 = ParserBase::expect(&this->super_ParserBase,DesignKeyword);
  topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.data_ =
       (pointer)topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.
                firstElement;
  topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len = 0;
  topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.cap = 5;
  while( true ) {
    local_1d0 = TVar23.info;
    local_1c8 = TVar23._0_8_;
    bVar10 = ParserBase::peek(&this->super_ParserBase,Identifier);
    if (!bVar10) break;
    pCVar15 = parseConfigCellIdentifier(this);
    rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.data_ = (pointer)pCVar15;
    SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax*>::
    emplace_back<slang::syntax::ConfigCellIdentifierSyntax*>
              ((SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax*> *)&topCells,
               (ConfigCellIdentifierSyntax **)&rules);
    bVar10 = ParserBase::peek(&this->super_ParserBase,Comma);
    TVar23.info = local_1d0;
    TVar23.kind = (undefined2)local_1c8;
    TVar23._2_1_ = local_1c8._2_1_;
    TVar23.numFlags.raw = local_1c8._3_1_;
    TVar23.rawLen = local_1c8._4_4_;
    if (bVar10) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x100850005);
      TVar23.info = local_1d0;
      TVar23.kind = (undefined2)local_1c8;
      TVar23._2_1_ = local_1c8._2_1_;
      TVar23.numFlags.raw = local_1c8._3_1_;
      TVar23.rawLen = local_1c8._4_4_;
    }
  }
  if (topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>.len == 0) {
    rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>._0_16_ =
         ParserBase::peek(&this->super_ParserBase);
    location = Token::location((Token *)&rules);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,location);
  }
  TVar24 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.len = 0;
  rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.data_ =
       (pointer)rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.firstElement;
  rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.cap = 5;
  local_2a8 = (SyntaxNode *)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        local_1e0 = TVar24.info;
        local_1d8 = TVar24._0_8_;
        token = ParserBase::peek(&this->super_ParserBase);
        TVar11 = token.kind;
        if (TVar11 != CellKeyword) break;
        ParserBase::consume(&this->super_ParserBase);
        pCVar15 = parseConfigCellIdentifier(this);
        bVar10 = ParserBase::peek(&this->super_ParserBase,UseKeyword);
        if (bVar10) {
          pCVar17 = (ConfigLiblistSyntax *)parseConfigUseClause(this);
        }
        else {
          pCVar17 = parseConfigLiblist(this);
        }
        sVar25 = Token::valueText(&pCVar15->library);
        if ((sVar25._M_len != 0) &&
           ((pCVar17->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind == ConfigLiblist)) {
          SVar22 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pCVar17);
          pDVar16 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xd0005,SVar22);
          SVar22 = Token::range(&pCVar15->library);
          Diagnostic::operator<<(pDVar16,SVar22);
        }
        TVar21 = token;
        TVar23 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.data_ =
             (pointer)slang::syntax::SyntaxFactory::cellConfigRule
                                (this_00,TVar21,pCVar15,&pCVar17->super_ConfigRuleClauseSyntax,
                                 TVar23);
        SmallVectorBase<slang::syntax::ConfigRuleSyntax*>::
        emplace_back<slang::syntax::ConfigRuleSyntax*>
                  ((SmallVectorBase<slang::syntax::ConfigRuleSyntax*> *)&rules,
                   (ConfigRuleSyntax **)&instanceNames);
        TVar24.info = local_1e0;
        TVar24.kind = (undefined2)local_1d8;
        TVar24._2_1_ = local_1d8._2_1_;
        TVar24.numFlags.raw = local_1d8._3_1_;
        TVar24.rawLen = local_1d8._4_4_;
      }
      if (TVar11 != InstanceKeyword) break;
      ParserBase::consume(&this->super_ParserBase);
      TVar21 = ParserBase::expect(&this->super_ParserBase,Identifier);
      uVar18 = TVar21._0_8_;
      instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.data_ =
           (pointer)instanceNames.
                    super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.
                    firstElement;
      instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.len = 0;
      instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.cap = 5;
      while( true ) {
        bVar10 = ParserBase::peek(&this->super_ParserBase,Dot);
        if (!bVar10) break;
        TVar23 = ParserBase::consume(&this->super_ParserBase);
        TVar24 = ParserBase::expect(&this->super_ParserBase,Identifier);
        local_218.super_SyntaxListBase._vptr_SyntaxListBase =
             (_func_int **)
             slang::syntax::SyntaxFactory::configInstanceIdentifier(this_00,TVar23,TVar24);
        SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
        emplace_back<slang::syntax::ConfigInstanceIdentifierSyntax*>
                  ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *)&instanceNames
                   ,(ConfigInstanceIdentifierSyntax **)&local_218);
      }
      bVar10 = ParserBase::peek(&this->super_ParserBase,UseKeyword);
      local_190 = TVar21.info;
      if (bVar10) {
        pCVar17 = (ConfigLiblistSyntax *)parseConfigUseClause(this);
        src = extraout_RDX;
      }
      else {
        pCVar17 = parseConfigLiblist(this);
        src = extraout_RDX_00;
      }
      TVar21 = token;
      iVar13 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::copy
                         (&instanceNames.
                           super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>,
                          (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      local_218.super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
      _M_ptr = (pointer)CONCAT44(extraout_var,iVar13);
      local_218.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_218.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_218.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_218.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a4018;
      TVar23 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      topModule.info = local_190;
      topModule.kind = (short)uVar18;
      topModule._2_1_ = (char)((ulong)uVar18 >> 0x10);
      topModule.numFlags.raw = (char)((ulong)uVar18 >> 0x18);
      topModule.rawLen = (int)((ulong)uVar18 >> 0x20);
      local_a8.super_SyntaxListBase._vptr_SyntaxListBase =
           (_func_int **)
           slang::syntax::SyntaxFactory::instanceConfigRule
                     (this_00,TVar21,topModule,&local_218,&pCVar17->super_ConfigRuleClauseSyntax,
                      TVar23);
      ctx = &local_a8;
      SmallVectorBase<slang::syntax::ConfigRuleSyntax*>::
      emplace_back<slang::syntax::ConfigRuleSyntax*>
                ((SmallVectorBase<slang::syntax::ConfigRuleSyntax*> *)&rules,
                 (ConfigRuleSyntax **)ctx);
      SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::cleanup
                (&instanceNames.
                  super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>,
                 (EVP_PKEY_CTX *)ctx);
      TVar24.info = local_1e0;
      TVar24.kind = (undefined2)local_1d8;
      TVar24._2_1_ = local_1d8._2_1_;
      TVar24.numFlags.raw = local_1d8._3_1_;
      TVar24.rawLen = local_1d8._4_4_;
    }
    if (TVar11 != DefaultKeyword) break;
    if (local_2a8 != (SyntaxNode *)0x0) {
      SVar22 = Token::range(&token);
      pDVar16 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x800005,SVar22);
      SVar22 = slang::syntax::SyntaxNode::sourceRange(local_2a8);
      Diagnostic::addNote(pDVar16,(DiagCode)0xa0001,SVar22);
    }
    ParserBase::consume(&this->super_ParserBase);
    pCVar17 = parseConfigLiblist(this);
    TVar21 = token;
    TVar23 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.data_ =
         (pointer)slang::syntax::SyntaxFactory::defaultConfigRule(this_00,TVar21,pCVar17,TVar23);
    SmallVectorBase<slang::syntax::ConfigRuleSyntax*>::
    emplace_back<slang::syntax::ConfigRuleSyntax*>
              ((SmallVectorBase<slang::syntax::ConfigRuleSyntax*> *)&rules,
               (ConfigRuleSyntax **)&instanceNames);
    TVar24.info = local_1e0;
    TVar24.kind = (undefined2)local_1d8;
    TVar24._2_1_ = local_1d8._2_1_;
    TVar24.numFlags.raw = local_1d8._3_1_;
    TVar24.rawLen = local_1d8._4_4_;
    local_2a8 = &rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.data_
                 [rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>.len - 1]->
                 super_SyntaxNode;
  }
  TVar21 = ParserBase::expect(&this->super_ParserBase,EndConfigKeyword);
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,nameToken,endBlock);
  uVar8 = local_1a8;
  pIVar7 = local_1b0;
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.len =
       CONCAT44(instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>
                .len._4_4_,1);
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.cap = 0;
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [0] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [1] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [2] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [3] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [4] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [5] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [6] = '\0';
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.firstElement
  [7] = '\0';
  instanceNames.stackBase[0] = (undefined1)local_198;
  instanceNames.stackBase[1] = local_198._1_1_;
  instanceNames.stackBase[2] = local_198._2_1_;
  instanceNames.stackBase[3] = local_198._3_1_;
  instanceNames.stackBase[4] = local_198._4_1_;
  instanceNames.stackBase[5] = local_198._5_1_;
  instanceNames.stackBase[6] = local_198._6_1_;
  instanceNames.stackBase[7] = local_198._7_1_;
  instanceNames.stackBase._8_8_ = local_1a0;
  instanceNames.stackBase[0x10] = (undefined1)local_198;
  instanceNames.stackBase[0x11] = local_198._1_1_;
  instanceNames.stackBase[0x12] = local_198._2_1_;
  instanceNames.stackBase[0x13] = local_198._3_1_;
  instanceNames.stackBase[0x14] = local_198._4_1_;
  instanceNames.stackBase[0x15] = local_198._5_1_;
  instanceNames.stackBase[0x16] = local_198._6_1_;
  instanceNames.stackBase[0x17] = local_198._7_1_;
  instanceNames.super_SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>.data_ =
       (pointer)&PTR_getChild_006a3268;
  iVar13 = SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>::copy
                     (&localparams.
                       super_SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>,
                      (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  uVar5 = local_1c8;
  pIVar4 = local_1d0;
  local_218.super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (pointer)CONCAT44(extraout_var_00,iVar13);
  local_218.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_218.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_218.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_218.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a39a0;
  SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::copy
            (&topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_01);
  uVar18 = local_1d8;
  pIVar2 = local_1e0;
  token.info._0_4_ = 1;
  token._0_8_ = &PTR_getChild_006a3a28;
  iVar13 = SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::copy
                     (&rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>,
                      (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_02);
  uVar9 = local_1a8;
  uVar6 = local_1c8;
  uVar3 = local_1d8;
  local_a8.super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var_01,iVar13);
  local_a8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_a8.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_a8.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_a8.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3ab0;
  attributes_00 = &instanceNames;
  semi1.info = pIVar7;
  local_1a8._0_2_ = (undefined2)uVar8;
  local_1a8._2_1_ = SUB81(uVar8,2);
  local_1a8._3_1_ = SUB81(uVar8,3);
  local_1a8._4_4_ = SUB84(uVar8,4);
  semi1.kind = (undefined2)local_1a8;
  semi1._2_1_ = local_1a8._2_1_;
  semi1.numFlags.raw = local_1a8._3_1_;
  semi1.rawLen = local_1a8._4_4_;
  design.info = pIVar4;
  local_1c8._0_2_ = (undefined2)uVar5;
  local_1c8._2_1_ = SUB81(uVar5,2);
  local_1c8._3_1_ = SUB81(uVar5,3);
  local_1c8._4_4_ = SUB84(uVar5,4);
  design.kind = (undefined2)local_1c8;
  design._2_1_ = local_1c8._2_1_;
  design.numFlags.raw = local_1c8._3_1_;
  design.rawLen = local_1c8._4_4_;
  semi2.info = pIVar2;
  local_1d8._0_2_ = (undefined2)uVar18;
  local_1d8._2_1_ = SUB81(uVar18,2);
  local_1d8._3_1_ = SUB81(uVar18,3);
  local_1d8._4_4_ = SUB84(uVar18,4);
  semi2.kind = (undefined2)local_1d8;
  semi2._2_1_ = local_1d8._2_1_;
  semi2.numFlags.raw = local_1d8._3_1_;
  semi2.rawLen = local_1d8._4_4_;
  config.info = local_1c0;
  config.kind = (undefined2)local_1b8;
  config._2_1_ = local_1b8._2_1_;
  config.numFlags.raw = local_1b8._3_1_;
  config.rawLen = local_1b8._4_4_;
  local_1d8 = uVar3;
  local_1c8 = uVar6;
  local_1a8 = uVar9;
  pCVar19 = slang::syntax::SyntaxFactory::configDeclaration
                      (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes_00,
                       config,nameToken,semi1,
                       (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)&local_218,
                       design,(SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)&token,semi2,
                       &local_a8,TVar21,endBlock);
  SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::cleanup
            (&rules.super_SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>,
             (EVP_PKEY_CTX *)attributes_00);
  SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::cleanup
            (&topCells.super_SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>,
             (EVP_PKEY_CTX *)attributes_00);
  SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>::cleanup
            (&localparams.
              super_SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>,
             (EVP_PKEY_CTX *)attributes_00);
  return pCVar19;
}

Assistant:

ConfigDeclarationSyntax& Parser::parseConfigDeclaration(AttrList attributes) {
    auto config = consume();
    auto name = expect(TokenKind::Identifier);
    auto semi1 = expect(TokenKind::Semicolon);

    SmallVector<ParameterDeclarationStatementSyntax*> localparams;
    while (peek(TokenKind::LocalParamKeyword)) {
        Token paramSemi;
        auto& paramBase = parseParameterDecl(consume(), &paramSemi);
        localparams.push_back(
            &factory.parameterDeclarationStatement(nullptr, paramBase, paramSemi));

        if (paramBase.kind == SyntaxKind::ParameterDeclaration) {
            for (auto decl : paramBase.as<ParameterDeclarationSyntax>().declarators) {
                if (decl->initializer) {
                    auto expr = decl->initializer->expr;
                    if (expr->kind == SyntaxKind::ParenthesizedExpression)
                        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                    switch (expr->kind) {
                        case SyntaxKind::NullLiteralExpression:
                        case SyntaxKind::StringLiteralExpression:
                        case SyntaxKind::RealLiteralExpression:
                        case SyntaxKind::TimeLiteralExpression:
                        case SyntaxKind::IntegerLiteralExpression:
                        case SyntaxKind::UnbasedUnsizedLiteralExpression:
                        case SyntaxKind::IntegerVectorExpression:
                            break;
                        default:
                            addDiag(diag::ConfigParamLiteral, expr->sourceRange());
                            break;
                    }
                }
            }
        }
    }

    auto design = expect(TokenKind::DesignKeyword);

    SmallVector<ConfigCellIdentifierSyntax*> topCells;
    while (peek(TokenKind::Identifier)) {
        topCells.push_back(&parseConfigCellIdentifier());
        if (peek(TokenKind::Comma))
            skipToken(diag::NoCommaInList);
    }

    if (topCells.empty())
        addDiag(diag::ExpectedIdentifier, peek().location());

    auto semi2 = expect(TokenKind::Semicolon);

    const ConfigRuleSyntax* defaultRule = nullptr;
    SmallVector<ConfigRuleSyntax*> rules;
    while (true) {
        auto token = peek();
        if (token.kind == TokenKind::DefaultKeyword) {
            if (defaultRule) {
                auto& diag = addDiag(diag::MultipleDefaultRules, token.range());
                diag.addNote(diag::NotePreviousDefinition, defaultRule->sourceRange());
            }

            consume();
            auto& liblist = parseConfigLiblist();
            rules.push_back(
                &factory.defaultConfigRule(token, liblist, expect(TokenKind::Semicolon)));
            defaultRule = rules.back();
        }
        else if (token.kind == TokenKind::CellKeyword) {
            consume();
            auto& cellName = parseConfigCellIdentifier();

            ConfigRuleClauseSyntax* rule;
            if (peek(TokenKind::UseKeyword))
                rule = &parseConfigUseClause();
            else
                rule = &parseConfigLiblist();

            if (!cellName.library.valueText().empty() && rule->kind == SyntaxKind::ConfigLiblist) {
                addDiag(diag::ConfigSpecificCellLiblist, rule->sourceRange())
                    << cellName.library.range();
            }

            rules.push_back(
                &factory.cellConfigRule(token, cellName, *rule, expect(TokenKind::Semicolon)));
        }
        else if (token.kind == TokenKind::InstanceKeyword) {
            consume();
            auto topModule = expect(TokenKind::Identifier);

            SmallVector<ConfigInstanceIdentifierSyntax*> instanceNames;
            while (peek(TokenKind::Dot)) {
                auto dot = consume();
                instanceNames.push_back(
                    &factory.configInstanceIdentifier(dot, expect(TokenKind::Identifier)));
            }

            ConfigRuleClauseSyntax* rule;
            if (peek(TokenKind::UseKeyword))
                rule = &parseConfigUseClause();
            else
                rule = &parseConfigLiblist();

            rules.push_back(&factory.instanceConfigRule(token, topModule, instanceNames.copy(alloc),
                                                        *rule, expect(TokenKind::Semicolon)));
        }
        else {
            break;
        }
    }

    auto endconfig = expect(TokenKind::EndConfigKeyword);
    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.configDeclaration(attributes, config, name, semi1, localparams.copy(alloc),
                                     design, topCells.copy(alloc), semi2, rules.copy(alloc),
                                     endconfig, blockName);
}